

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlNewChild(xmlNodePtr parent,xmlNsPtr ns,xmlChar *name,xmlChar *content)

{
  _xmlNode *p_Var1;
  xmlNodePtr prev;
  xmlNodePtr cur;
  xmlChar *content_local;
  xmlChar *name_local;
  xmlNsPtr ns_local;
  xmlNodePtr parent_local;
  
  if ((parent == (xmlNodePtr)0x0) || (name == (xmlChar *)0x0)) {
    parent_local = (xmlNodePtr)0x0;
  }
  else {
    name_local = (xmlChar *)ns;
    switch(parent->type) {
    case XML_ELEMENT_NODE:
      if (ns == (xmlNsPtr)0x0) {
        name_local = (xmlChar *)parent->ns;
      }
      break;
    default:
      return (xmlNodePtr)0x0;
    case XML_DOCUMENT_NODE:
    case XML_DOCUMENT_FRAG_NODE:
    case XML_HTML_DOCUMENT_NODE:
    }
    parent_local = xmlNewDocNode(parent->doc,(xmlNsPtr)name_local,name,content);
    if (parent_local == (xmlNodePtr)0x0) {
      parent_local = (xmlNodePtr)0x0;
    }
    else {
      parent_local->parent = parent;
      if (parent->children == (_xmlNode *)0x0) {
        parent->children = parent_local;
        parent->last = parent_local;
      }
      else {
        p_Var1 = parent->last;
        p_Var1->next = parent_local;
        parent_local->prev = p_Var1;
        parent->last = parent_local;
      }
    }
  }
  return parent_local;
}

Assistant:

xmlNodePtr
xmlNewChild(xmlNodePtr parent, xmlNsPtr ns,
            const xmlChar *name, const xmlChar *content) {
    xmlNodePtr cur, prev;

    if ((parent == NULL) || (name == NULL))
	return(NULL);

    switch (parent->type) {
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
        case XML_DOCUMENT_FRAG_NODE:
            break;

        case XML_ELEMENT_NODE:
            if (ns == NULL)
                ns = parent->ns;
            break;

        default:
            return(NULL);
    }

    cur = xmlNewDocNode(parent->doc, ns, name, content);
    if (cur == NULL)
        return(NULL);

    /*
     * add the new element at the end of the children list.
     */
    cur->parent = parent;
    if (parent->children == NULL) {
        parent->children = cur;
	parent->last = cur;
    } else {
        prev = parent->last;
	prev->next = cur;
	cur->prev = prev;
	parent->last = cur;
    }

    return(cur);
}